

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O0

void __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int *size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  RPNnode *pRVar4;
  RPNnode *local_50;
  int *size_local;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_local;
  
  this->_size = *size;
  this->_top = -1;
  uVar2 = (ulong)this->_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pRVar4 = (RPNnode *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_50 = pRVar4;
    do {
      iRpn::RPNnode::RPNnode(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pRVar4 + uVar2);
  }
  this->_data = pRVar4;
  return;
}

Assistant:

iStack(const int& size = 1024):_size(size),_top(-1)
    {
        _data = new Type[_size];
    }